

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiID *pIVar3;
  ImGuiID IVar4;
  ImGuiID *__dest;
  int iVar5;
  int iVar6;
  
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  IVar4 = ImGuiWindow::GetIDNoKeepAlive(this,str_id_begin,str_id_end);
  iVar6 = (this->IDStack).Size;
  iVar2 = (this->IDStack).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiID *)(*GImAllocatorAllocFunc)((long)iVar6 << 2,GImAllocatorUserData);
      pIVar3 = (this->IDStack).Data;
      if (pIVar3 != (ImGuiID *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->IDStack).Size << 2);
        pIVar3 = (this->IDStack).Data;
        if ((pIVar3 != (ImGuiID *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar6;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = IVar4;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(str_id_begin, str_id_end);
    window->IDStack.push_back(id);
}